

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O3

CordzStatistics * __thiscall
absl::lts_20240722::cord_internal::CordzInfo::GetCordzStatistics
          (CordzStatistics *__return_storage_ptr__,CordzInfo *this)

{
  size_t *psVar1;
  RefcountAndFlags *pRVar2;
  uint8_t uVar3;
  CordRep *pCVar4;
  MethodIdentifier MVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  CordRep *pCVar9;
  int i;
  long lVar10;
  undefined1 auVar11 [16];
  RepRef RVar12;
  CordRepAnalyzer analyzer;
  CordRepAnalyzer local_30;
  
  lVar10 = 0;
  memset(__return_storage_ptr__,0,0x150);
  MVar5 = this->parent_method_;
  __return_storage_ptr__->method = this->method_;
  __return_storage_ptr__->parent_method = MVar5;
  do {
    (__return_storage_ptr__->update_tracker).values_[lVar10].super_atomic<long>.
    super___atomic_base<long>._M_i =
         (this->update_tracker_).values_[lVar10].super_atomic<long>.super___atomic_base<long>._M_i;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x19);
  absl::lts_20240722::Mutex::Lock();
  pCVar4 = this->rep_;
  if (pCVar4 != (CordRep *)0x0) {
    LOCK();
    (pCVar4->refcount).count_.super___atomic_base<int>._M_i =
         (pCVar4->refcount).count_.super___atomic_base<int>._M_i + 2;
    UNLOCK();
  }
  absl::lts_20240722::Mutex::Unlock();
  if (pCVar4 != (CordRep *)0x0) {
    __return_storage_ptr__->size = pCVar4->length;
    local_30.memory_usage_.total = 0;
    local_30.memory_usage_.fair_share = 0.0;
    uVar6 = (pCVar4->refcount).count_.super___atomic_base<int>._M_i >> 1;
    iVar7 = 1;
    if (1 < uVar6) {
      iVar7 = uVar6 - 1;
    }
    sVar8 = (size_t)iVar7;
    local_30.statistics_ = __return_storage_ptr__;
    if (pCVar4->tag == '\x02') {
      __return_storage_ptr__->node_count = __return_storage_ptr__->node_count + 1;
      psVar1 = &(__return_storage_ptr__->node_counts).crc;
      *psVar1 = *psVar1 + 1;
      local_30.memory_usage_.total = 0x20;
      auVar11._8_4_ = iVar7 >> 0x1f;
      auVar11._0_8_ = sVar8;
      auVar11._12_4_ = 0x45300000;
      local_30.memory_usage_.fair_share =
           32.0 / ((auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,iVar7) - 4503599627370496.0)) + 0.0;
      pCVar9 = (CordRep *)pCVar4[1].length;
      if (pCVar9 == (CordRep *)0x0) {
        pCVar9 = (CordRep *)0x0;
        sVar8 = 0;
      }
      else {
        sVar8 = sVar8 * (long)((pCVar9->refcount).count_.super___atomic_base<int>._M_i >> 1);
        local_30.memory_usage_.total = 0x20;
      }
    }
    else {
      pCVar9 = pCVar4;
      if (pCVar4->tag == '\0') goto LAB_00102d9a;
    }
    RVar12.refcount = sVar8;
    RVar12.rep = pCVar9;
    RVar12 = anon_unknown_16::CordRepAnalyzer::CountLinearReps
                       (&local_30,RVar12,&local_30.memory_usage_);
    if (RVar12.rep != (CordRep *)0x0) {
      uVar3 = (RVar12.rep)->tag;
      if (uVar3 != '\x03') {
        if (uVar3 != '\0') {
          __assert_fail("false && \"repref.tag() == CordRepKind::UNUSED_0\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                        ,0x6a,
                        "auto absl::cord_internal::(anonymous namespace)::CordRepAnalyzer::AnalyzeCordRep(const CordRep *)::(anonymous class)::operator()() const"
                       );
        }
LAB_00102d9a:
        __assert_fail("false && \"rep == nullptr || rep->tag != CordRepKind::UNUSED_0\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                      ,0x87,
                      "auto absl::cord_internal::(anonymous namespace)::CordRepAnalyzer::RepRef::tag()::(anonymous class)::operator()() const"
                     );
      }
      anon_unknown_16::CordRepAnalyzer::AnalyzeBtree(&local_30,RVar12);
    }
    (local_30.statistics_)->estimated_memory_usage =
         (local_30.statistics_)->estimated_memory_usage + local_30.memory_usage_.total;
    (local_30.statistics_)->estimated_fair_share_memory_usage =
         (local_30.statistics_)->estimated_fair_share_memory_usage +
         ((long)(local_30.memory_usage_.fair_share - 9.223372036854776e+18) &
          (long)local_30.memory_usage_.fair_share >> 0x3f | (long)local_30.memory_usage_.fair_share)
    ;
    LOCK();
    pRVar2 = &pCVar4->refcount;
    uVar6 = (pRVar2->count_).super___atomic_base<int>._M_i;
    (pRVar2->count_).super___atomic_base<int>._M_i =
         (pRVar2->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar6 & 1) == 0 && (int)uVar6 < 1) {
      __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0xaa,
                    "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
    }
    if (uVar6 == 2) {
      absl::lts_20240722::cord_internal::CordRep::Destroy(pCVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CordzStatistics CordzInfo::GetCordzStatistics() const {
  CordzStatistics stats;
  stats.method = method_;
  stats.parent_method = parent_method_;
  stats.update_tracker = update_tracker_;
  if (CordRep* rep = RefCordRep()) {
    stats.size = rep->length;
    CordRepAnalyzer analyzer(stats);
    analyzer.AnalyzeCordRep(rep);
    CordRep::Unref(rep);
  }
  return stats;
}